

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void av1_fwd_txfm2d_16x32_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  char cVar2;
  fwd_transform_1d_sse4_1 p_Var3;
  fwd_transform_1d_sse4_1 p_Var4;
  int iVar5;
  int iVar6;
  byte in_CL;
  __m128i *in_RSI;
  int i;
  int bitrow;
  int bitcol;
  fwd_transform_1d_sse4_1 row_txfm;
  fwd_transform_1d_sse4_1 col_txfm;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i *outcoef128;
  __m128i in [128];
  int in_stack_fffffffffffff79c;
  undefined4 in_stack_fffffffffffff7a0;
  longlong local_828 [6];
  int in_stack_fffffffffffff80c;
  int in_stack_fffffffffffff810;
  int in_stack_fffffffffffff814;
  __m128i *in_stack_fffffffffffff818;
  __m128i *in_stack_fffffffffffff820;
  int in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbcc;
  int in_stack_fffffffffffffbd0;
  int in_stack_fffffffffffffbd4;
  __m128i *in_stack_fffffffffffffbd8;
  int16_t *in_stack_fffffffffffffbe0;
  
  iVar5 = get_txw_idx('\t');
  iVar6 = get_txh_idx('\t');
  p_Var3 = col_highbd_txfm8x32_arr[in_CL];
  p_Var4 = row_highbd_txfm8x32_arr[in_CL];
  cVar1 = av1_fwd_cos_bit_col[iVar5][iVar6];
  cVar2 = av1_fwd_cos_bit_row[iVar5][iVar6];
  load_buffer_16x16(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                    in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8);
  load_buffer_16x16(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                    in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8);
  for (iVar5 = 0; iVar5 < 4; iVar5 = iVar5 + 1) {
    (*p_Var3)((__m128i *)(local_828 + (long)iVar5 * 2),(__m128i *)(local_828 + (long)iVar5 * 2),
              (int)cVar1,4);
  }
  col_txfm_16x16_rounding
            ((__m128i *)CONCAT44(iVar5,in_stack_fffffffffffff7a0),in_stack_fffffffffffff79c);
  col_txfm_16x16_rounding
            ((__m128i *)CONCAT44(iVar5,in_stack_fffffffffffff7a0),in_stack_fffffffffffff79c);
  transpose_8nx8n((__m128i *)local_828,in_RSI,0x10,0x20);
  (*p_Var4)(in_RSI,(__m128i *)local_828,(int)cVar2,8);
  av1_round_shift_rect_array_32_sse4_1
            (in_stack_fffffffffffff820,in_stack_fffffffffffff818,in_stack_fffffffffffff814,
             in_stack_fffffffffffff810,in_stack_fffffffffffff80c);
  return;
}

Assistant:

void av1_fwd_txfm2d_16x32_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  __m128i in[128];
  __m128i *outcoef128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X32];
  const int txw_idx = get_txw_idx(TX_16X32);
  const int txh_idx = get_txh_idx(TX_16X32);
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm8x32_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm8x32_arr[tx_type];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];

  // column transform
  load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
  load_buffer_16x16(input + 16 * stride, in + 64, stride, 0, 0, shift[0]);

  for (int i = 0; i < 4; i++) {
    col_txfm((in + i), (in + i), bitcol, 4);
  }
  col_txfm_16x16_rounding(&in[0], -shift[1]);
  col_txfm_16x16_rounding(&in[64], -shift[1]);
  transpose_8nx8n(in, outcoef128, 16, 32);

  // row transform
  row_txfm(outcoef128, in, bitrow, 8);
  av1_round_shift_rect_array_32_sse4_1(in, outcoef128, 128, -shift[2],
                                       NewSqrt2);
  (void)bd;
}